

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void llb_set_quality_of_service(llb_quality_of_service_t level)

{
  Optional<llbuild::basic::QualityOfService> OVar1;
  
  if (level == llb_quality_of_service_unspecified) {
    __assert_fail("level != llb_quality_of_service_unspecified",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x5d5,"void llb_set_quality_of_service(llb_quality_of_service_t)");
  }
  OVar1 = getQoSFromLLBQoS(level);
  if (((ulong)OVar1.Storage >> 0x20 & 1) == 0) {
    return;
  }
  llbuild::basic::setDefaultQualityOfService
            ((QualityOfService)
             OVar1.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer.
             super_AlignedCharArray<4UL,_4UL>);
  return;
}

Assistant:

void llb_set_quality_of_service(llb_quality_of_service_t level) {
  assert(level != llb_quality_of_service_unspecified);
  Optional<QualityOfService> qos = getQoSFromLLBQoS(level);
  if (qos.hasValue())
    setDefaultQualityOfService(qos.getValue());
}